

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O3

char * jsonnet_evaluate_file_stream(JsonnetVm *vm,char *filename,int *error)

{
  char *pcVar1;
  
  pcVar1 = jsonnet_evaluate_file_aux(vm,filename,error,STREAM);
  return pcVar1;
}

Assistant:

char *jsonnet_evaluate_file_stream(JsonnetVm *vm, const char *filename, int *error)
{
    TRY
        return jsonnet_evaluate_file_aux(vm, filename, error, STREAM);
    CATCH("jsonnet_evaluate_file_stream")
    return nullptr;  // Never happens.
}